

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelDescriptor.cpp
# Opt level: O1

void amrex::ParallelDescriptor::ReadAndBcastFile
               (string *filename,Vector<char,_std::allocator<char>_> *charBuf,bool bExitOnError,
               MPI_Comm *comm)

{
  void *__s;
  value_type *__val;
  long lVar1;
  ifstream iss;
  long local_238 [2];
  long local_228 [2];
  int aiStack_218 [122];
  
  __s = operator_new(0x200000);
  memset(__s,0,0x200000);
  std::ifstream::ifstream(local_238);
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    (**(code **)(local_228[0] + 0x18))(local_228,__s,0x200000);
    std::ifstream::open((char *)local_238,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
    if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
      std::istream::seekg((long)local_238,_S_beg);
      lVar1 = std::istream::tellg();
      std::istream::seekg((long)local_238,_S_beg);
      goto LAB_00549797;
    }
    lVar1 = -1;
    if (!bExitOnError) goto LAB_00549797;
    FileOpenFailed(filename);
  }
  lVar1 = 0;
LAB_00549797:
  if (lVar1 != -1) {
    std::vector<char,_std::allocator<char>_>::resize
              (&charBuf->super_vector<char,_std::allocator<char>_>,lVar1 + 1);
    if (*(int *)(ParallelContext::frames + 0xc) == 0) {
      std::istream::read((char *)local_238,
                         (long)(charBuf->super_vector<char,_std::allocator<char>_>).
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
      std::ifstream::close();
    }
    (charBuf->super_vector<char,_std::allocator<char>_>).
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start[lVar1]
         = '\0';
  }
  std::ifstream::~ifstream(local_238);
  operator_delete(__s,0x200000);
  return;
}

Assistant:

void
ReadAndBcastFile (const std::string& filename, Vector<char>& charBuf,
                  bool bExitOnError, const MPI_Comm&comm)
{
    enum { IO_Buffer_Size = 262144 * 8 };

#ifdef BL_SETBUF_SIGNED_CHAR
    typedef signed char Setbuf_Char_Type;
#else
    typedef char Setbuf_Char_Type;
#endif

    Vector<Setbuf_Char_Type> io_buffer(IO_Buffer_Size);

    Long fileLength(0), fileLengthPadded(0);

    std::ifstream iss;

    if (ParallelDescriptor::IOProcessor()) {
        iss.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
        iss.open(filename.c_str(), std::ios::in);
        if ( ! iss.good()) {
          if(bExitOnError) {
            amrex::FileOpenFailed(filename);
          } else {
            fileLength = -1;
          }
        } else {
          iss.seekg(0, std::ios::end);
          fileLength = static_cast<std::streamoff>(iss.tellg());
          iss.seekg(0, std::ios::beg);
        }
    }
    ParallelDescriptor::Bcast(&fileLength, 1,
                              ParallelDescriptor::IOProcessorNumber(), comm);

    if(fileLength == -1) {
      return;
    }

    fileLengthPadded = fileLength + 1;
//    fileLengthPadded += fileLengthPadded % 8;
    charBuf.resize(fileLengthPadded);
    if (ParallelDescriptor::IOProcessor()) {
        iss.read(charBuf.dataPtr(), fileLength);
        iss.close();
    }
    ParallelDescriptor::Bcast(charBuf.dataPtr(), fileLengthPadded,
                              ParallelDescriptor::IOProcessorNumber(), comm);
    charBuf[fileLength] = '\0';
}